

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lp_test.cc
# Opt level: O0

void __thiscall
fizplex::LPTest_AddColumnIncreasesColumnCount_Test::TestBody
          (LPTest_AddColumnIncreasesColumnCount_Test *this)

{
  undefined1 uVar1;
  size_t sVar2;
  char *message;
  char *in_R9;
  AssertionResult gtest_ar_;
  LP lp;
  bool *in_stack_fffffffffffffef8;
  undefined7 in_stack_ffffffffffffff00;
  undefined1 in_stack_ffffffffffffff07;
  undefined8 in_stack_ffffffffffffff08;
  ColType _type;
  LP *this_00;
  string local_e8 [24];
  undefined8 in_stack_ffffffffffffff30;
  AssertHelper local_c8;
  Message local_c0;
  undefined1 local_b1;
  AssertionResult local_b0 [2];
  LP local_90;
  
  _type = (ColType)((ulong)in_stack_ffffffffffffff08 >> 0x20);
  this_00 = &local_90;
  LP::LP((LP *)in_stack_ffffffffffffff30);
  LP::add_column(this_00,_type,(double)CONCAT17(in_stack_ffffffffffffff07,in_stack_ffffffffffffff00)
                 ,(double)in_stack_fffffffffffffef8,9.23412644602457e-318);
  sVar2 = LP::column_count((LP *)0x1c84dc);
  local_b1 = sVar2 == 1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)CONCAT17(in_stack_ffffffffffffff07,in_stack_ffffffffffffff00),
             in_stack_fffffffffffffef8,(type *)0x1c8504);
  uVar1 = testing::AssertionResult::operator_cast_to_bool(local_b0);
  if (!(bool)uVar1) {
    testing::Message::Message(&local_c0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_e8,(internal *)local_b0,(AssertionResult *)"lp.column_count() == 1",
               "false","true",in_R9);
    message = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LeFiz[P]Fizplex/src/lp_test.cc"
               ,0x35,message);
    testing::internal::AssertHelper::operator=(&local_c8,&local_c0);
    testing::internal::AssertHelper::~AssertHelper(&local_c8);
    std::__cxx11::string::~string(local_e8);
    testing::Message::~Message((Message *)0x1c85d6);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1c8630);
  LP::~LP((LP *)CONCAT17(uVar1,in_stack_ffffffffffffff00));
  return;
}

Assistant:

TEST(LPTest, AddColumnIncreasesColumnCount) {
  LP lp;
  lp.add_column(ColType::Bounded, -1.33333, 302);
  EXPECT_TRUE(lp.column_count() == 1);
}